

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase66::run(TestCase66 *this)

{
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  ReaderOptions options;
  size_t size;
  Reader local_1f8;
  Reader local_1c8;
  Reader local_188;
  ReaderOptions local_158;
  ArrayPtr<kj::ArrayPtr<const_capnp::word>_> local_140;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_130;
  undefined1 local_120 [8];
  SegmentArrayMessageReader reader;
  undefined1 local_28 [8];
  ArrayPtr<const_capnp::word> segments [1];
  AlignedData<1> nullRoot;
  TestCase66 *this_local;
  
  segments[0].size_ = 0;
  size = 1;
  join_0x00000010_0x00000000_ = kj::arrayPtr<capnp::word>((word *)&segments[0].size_,1);
  _local_28 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&reader.segments.size_);
  local_140 = kj::arrayPtr<kj::ArrayPtr<capnp::word_const>>
                        ((ArrayPtr<const_capnp::word> *)local_28,size);
  local_130 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_140);
  local_158.traversalLimitInWords = 0;
  local_158.nestingLimit = 0;
  local_158._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_158);
  options.nestingLimit = local_158.nestingLimit;
  options.traversalLimitInWords = local_158.traversalLimitInWords;
  options._12_4_ = 0;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_120,local_130,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestDefaults>
            (&local_188,(MessageReader *)local_120);
  reader_00._reader.capTable = (CapTableReader *)local_188._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_188._reader.capTable;
  reader_00._reader.data = local_188._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_188._reader._32_8_;
  reader_00._reader.dataSize = local_188._reader.nestingLimit;
  reader_00._reader.pointerCount = local_188._reader._44_2_;
  reader_00._reader._38_2_ = local_188._reader._46_2_;
  reader_00._reader._40_8_ = size;
  checkTestMessage(reader_00);
  readMessageUnchecked<capnproto_test::capnp::test::TestDefaults>
            (&local_1c8,(word *)&segments[0].size_);
  reader_01._reader.capTable = (CapTableReader *)local_1c8._reader.data;
  reader_01._reader.segment = (SegmentReader *)local_1c8._reader.capTable;
  reader_01._reader.data = local_1c8._reader.pointers;
  reader_01._reader.pointers = (WirePointer *)local_1c8._reader._32_8_;
  reader_01._reader.dataSize = local_1c8._reader.nestingLimit;
  reader_01._reader.pointerCount = local_1c8._reader._44_2_;
  reader_01._reader._38_2_ = local_1c8._reader._46_2_;
  reader_01._reader._40_8_ = size;
  checkTestMessage(reader_01);
  local_1f8._reader.dataSize = 0;
  local_1f8._reader.pointerCount = 0;
  local_1f8._reader._38_2_ = 0;
  local_1f8._reader.nestingLimit = 0;
  local_1f8._reader._44_4_ = 0;
  local_1f8._reader.data = (void *)0x0;
  local_1f8._reader.pointers = (WirePointer *)0x0;
  local_1f8._reader.segment = (SegmentReader *)0x0;
  local_1f8._reader.capTable = (CapTableReader *)0x0;
  capnproto_test::capnp::test::TestDefaults::Reader::Reader(&local_1f8);
  reader_02._reader.capTable = (CapTableReader *)local_1f8._reader.data;
  reader_02._reader.segment = (SegmentReader *)local_1f8._reader.capTable;
  reader_02._reader.data = local_1f8._reader.pointers;
  reader_02._reader.pointers = (WirePointer *)local_1f8._reader._32_8_;
  reader_02._reader.dataSize = local_1f8._reader.nestingLimit;
  reader_02._reader.pointerCount = local_1f8._reader._44_2_;
  reader_02._reader._38_2_ = local_1f8._reader._46_2_;
  reader_02._reader._40_8_ = size;
  checkTestMessage(reader_02);
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_120);
  return;
}

Assistant:

TEST(Encoding, Defaults) {
  AlignedData<1> nullRoot = {{0, 0, 0, 0, 0, 0, 0, 0}};
  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(nullRoot.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));

  checkTestMessage(reader.getRoot<TestDefaults>());
  checkTestMessage(readMessageUnchecked<TestDefaults>(nullRoot.words));

  checkTestMessage(TestDefaults::Reader());
}